

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# character.cpp
# Opt level: O1

int ORPG::Characters::request_selection(RaceSelector *factory)

{
  char *pcVar1;
  race_node *prVar2;
  pointer pcVar3;
  pointer pbVar4;
  ostream *poVar5;
  int *piVar6;
  undefined8 uVar7;
  long lVar8;
  pointer pbVar9;
  int iVar10;
  int iVar11;
  size_type sVar12;
  ulong uVar13;
  bool bVar14;
  bool bVar15;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  list;
  string str;
  string input;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_d8;
  undefined1 local_b8 [40];
  pointer local_90;
  long local_88;
  undefined1 local_80 [32];
  long local_60;
  long local_58 [2];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  local_90 = (pointer)local_80;
  local_88 = 0;
  local_80[0] = 0;
  local_d8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_d8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_d8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  prVar2 = factory->current;
  if ((prVar2 != (race_node *)0x0) &&
     ((prVar2->children).
      super__Vector_base<ORPG::Characters::RaceSelector::race_node_*,_std::allocator<ORPG::Characters::RaceSelector::race_node_*>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (prVar2->children).
      super__Vector_base<ORPG::Characters::RaceSelector::race_node_*,_std::allocator<ORPG::Characters::RaceSelector::race_node_*>_>
      ._M_impl.super__Vector_impl_data._M_finish)) {
    RaceSelector::current_options_abi_cxx11_(&local_48,factory);
    local_b8._16_8_ =
         local_d8.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_b8._8_8_ =
         local_d8.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_b8._0_8_ =
         local_d8.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_d8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         local_48.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_d8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         local_48.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_d8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         local_48.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_48.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_48.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_48.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_b8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_48);
  }
  sVar12 = 0xffffffff;
  do {
    pbVar4 = local_d8.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    iVar10 = (int)sVar12;
    if ((-1 < iVar10) &&
       (iVar10 < (int)((ulong)((long)local_d8.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)local_d8.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start) >> 5))) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_d8);
      if (local_90 != (pointer)local_80) {
        operator_delete(local_90,CONCAT71(local_80._1_7_,local_80[0]) + 1);
      }
      return iVar10;
    }
    local_80._16_8_ = sVar12;
    if (local_d8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_d8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      iVar10 = 0;
      iVar11 = -1;
      uVar13 = 1;
      pbVar9 = local_d8.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      do {
        local_b8._0_8_ = local_b8 + 0x10;
        pcVar3 = (pbVar9->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_b8,pcVar3,pcVar3 + pbVar9->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\t",1);
        poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar10);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,") ",2);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar5,(char *)local_b8._0_8_,local_b8._8_8_);
        if ((int)(uVar13 / 3) * 3 + iVar11 == 0) {
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'P');
          std::ostream::put('P');
          std::ostream::flush();
        }
        if ((pointer)local_b8._0_8_ != (pointer)(local_b8 + 0x10)) {
          operator_delete((void *)local_b8._0_8_,
                          (ulong)((long)&((_Alloc_hider *)local_b8._16_8_)->_M_p + 1));
        }
        pbVar9 = pbVar9 + 1;
        iVar11 = iVar11 + -1;
        uVar13 = (ulong)((int)uVar13 + 1);
        iVar10 = iVar10 + 1;
      } while (pbVar9 != pbVar4);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n#? ",4);
    sVar12 = local_80._16_8_;
    ORPG::Utils::safeGetline((istream *)&std::cin,(string *)&local_90);
    local_80._24_8_ = local_58;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(local_80 + 0x18),local_90,
               (char *)((long)&(local_90->_M_dataplus)._M_p + local_88));
    bVar14 = local_60 == 0;
    if ((!bVar14) && ((int)*(char *)local_80._24_8_ - 0x30U < 10)) {
      lVar8 = 1;
      do {
        bVar14 = local_60 == lVar8;
        if (bVar14) break;
        pcVar1 = (char *)(local_80._24_8_ + lVar8);
        lVar8 = lVar8 + 1;
      } while ((int)*pcVar1 - 0x30U < 10);
    }
    bVar15 = local_60 != 0;
    if ((long *)local_80._24_8_ != local_58) {
      operator_delete((void *)local_80._24_8_,local_58[0] + 1);
    }
    pbVar4 = local_90;
    if ((bool)(bVar15 & bVar14)) {
      piVar6 = __errno_location();
      iVar10 = *piVar6;
      *piVar6 = 0;
      sVar12 = strtol((char *)pbVar4,(char **)local_b8,10);
      if ((pointer)local_b8._0_8_ == pbVar4) {
        std::__throw_invalid_argument("stoi");
LAB_0010a447:
        uVar7 = std::__throw_out_of_range("stoi");
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_d8);
        if (local_90 != (pointer)local_80) {
          operator_delete(local_90,CONCAT71(local_80._1_7_,local_80[0]) + 1);
        }
        _Unwind_Resume(uVar7);
      }
      if (((long)(int)sVar12 != sVar12) || (*piVar6 == 0x22)) goto LAB_0010a447;
      if (*piVar6 == 0) {
        *piVar6 = iVar10;
      }
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"invalid input!",0xe)
      ;
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'P');
      std::ostream::put('P');
      std::ostream::flush();
    }
    std::ios::clear((int)*(undefined8 *)(std::cin + -0x18) + 0x120218);
  } while( true );
}

Assistant:

uint RaceSelector::current_id() {
            if(current != NULL) return current->raceID;
            return -1;
        }